

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncAbs(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  const_reference pvVar1;
  anon_union_8_2_b358304e_for_ExpressionValue_1 local_40;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  ExpressionValue *result;
  
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](parameters,0);
  if (pvVar1->type == Integer) {
    __return_storage_ptr__->type = Integer;
    pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                       (parameters,0);
    if ((pvVar1->field_1).intValue < 0) {
      pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                         (parameters,0);
      local_40.intValue = -(pvVar1->field_1).intValue;
    }
    else {
      pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                         (parameters,0);
      local_40 = pvVar1->field_1;
    }
    __return_storage_ptr__->field_1 = local_40;
  }
  else if (pvVar1->type == Float) {
    __return_storage_ptr__->type = Float;
    pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                       (parameters,0);
    (__return_storage_ptr__->field_1).intValue = (pvVar1->field_1).intValue & 0x7fffffffffffffff;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncAbs(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::Float:
		result.type = ExpressionValueType::Float;
		result.floatValue = fabs(parameters[0].floatValue);
		break;
	case ExpressionValueType::Integer:
		result.type = ExpressionValueType::Integer;
		result.intValue = parameters[0].intValue >= 0 ?
			parameters[0].intValue : -parameters[0].intValue;
		break;
	default:
		break;
	}

	return result;
}